

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::Writer::processDispatch(Writer *this)

{
  bool bVar1;
  element_type *this_00;
  ulong uVar2;
  size_type sVar3;
  reference loggerId;
  stringstream_t *psVar4;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  string local_70 [48];
  ulong local_40;
  size_t i;
  string_t logMessage;
  bool firstDispatched;
  Writer *this_local;
  
  this_00 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)elStorage);
  bVar1 = Storage::hasFlag(this_00,MultiLoggerSupport);
  if (bVar1) {
    logMessage.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)&i);
    local_40 = 0;
    do {
      if ((this->m_proceed & 1U) == 0) {
        if (this->m_logger != (Logger *)0x0) {
          psVar4 = Logger::stream_abi_cxx11_(this->m_logger);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_90,"",&local_91);
          std::__cxx11::stringstream::str((string *)psVar4);
          std::__cxx11::string::~string(local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
          (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
        }
      }
      else {
        if ((logMessage.field_2._M_local_buf[0xf] & 1U) == 0) {
          logMessage.field_2._M_local_buf[0xf] = '\x01';
          sVar3 = utils::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&this->m_loggerIds);
          if (1 < sVar3) {
            Logger::stream_abi_cxx11_(this->m_logger);
            std::__cxx11::stringstream::str();
            std::__cxx11::string::operator=((string *)&i,local_70);
            std::__cxx11::string::~string(local_70);
          }
        }
        else {
          psVar4 = Logger::stream_abi_cxx11_(this->m_logger);
          std::operator<<((ostream *)(psVar4 + 0x10),(string *)&i);
        }
        triggerDispatch(this);
      }
      uVar2 = local_40 + 1;
      sVar3 = utils::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&this->m_loggerIds);
      if (uVar2 < sVar3) {
        loggerId = utils::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&this->m_loggerIds,local_40 + 1);
        initializeLogger(this,loggerId,true,true);
      }
      uVar2 = local_40 + 1;
      local_40 = uVar2;
      sVar3 = utils::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&this->m_loggerIds);
    } while (uVar2 < sVar3);
    std::__cxx11::string::~string((string *)&i);
  }
  else if ((this->m_proceed & 1U) == 0) {
    if (this->m_logger != (Logger *)0x0) {
      psVar4 = Logger::stream_abi_cxx11_(this->m_logger);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"",&local_b9);
      std::__cxx11::stringstream::str((string *)psVar4);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
    }
  }
  else {
    triggerDispatch(this);
  }
  return;
}

Assistant:

void Writer::processDispatch() {
#if ELPP_LOGGING_ENABLED
  if (ELPP->hasFlag(LoggingFlag::MultiLoggerSupport)) {
    bool firstDispatched = false;
    base::type::string_t logMessage;
    std::size_t i = 0;
    do {
      if (m_proceed) {
        if (firstDispatched) {
          m_logger->stream() << logMessage;
        } else {
          firstDispatched = true;
          if (m_loggerIds.size() > 1) {
            logMessage = m_logger->stream().str();
          }
        }
        triggerDispatch();
      } else if (m_logger != nullptr) {
        m_logger->stream().str(ELPP_LITERAL(""));
        m_logger->releaseLock();
      }
      if (i + 1 < m_loggerIds.size()) {
        initializeLogger(m_loggerIds.at(i + 1));
      }
    } while (++i < m_loggerIds.size());
  } else {
    if (m_proceed) {
      triggerDispatch();
    } else if (m_logger != nullptr) {
      m_logger->stream().str(ELPP_LITERAL(""));
      m_logger->releaseLock();
    }
  }
#else
  if (m_logger != nullptr) {
    m_logger->stream().str(ELPP_LITERAL(""));
    m_logger->releaseLock();
  }
#endif // ELPP_LOGGING_ENABLED
}